

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O3

void Gia_ManCollectTfo_rec(Gia_Man_t *p,int iObj,Vec_Int_t *vNodes)

{
  uint uVar1;
  int *piVar2;
  Vec_Int_t *pVVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  
  if (p->nTravIdsAlloc <= iObj) {
    __assert_fail("Id < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x268,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
  }
  if (p->pTravIds[iObj] != p->nTravIds) {
    p->pTravIds[iObj] = p->nTravIds;
    if ((iObj < 0) || (p->nObjs <= iObj)) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    iVar6 = (int)*(ulong *)(p->pObjs + (uint)iObj);
    uVar4 = *(ulong *)(p->pObjs + (uint)iObj) & 0x1fffffff;
    if (-1 < iVar6 || uVar4 == 0x1fffffff) {
      if ((iVar6 < 0) || ((int)uVar4 == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDfs.c"
                      ,0x262,"void Gia_ManCollectTfo_rec(Gia_Man_t *, int, Vec_Int_t *)");
      }
      pVVar3 = p->vFanoutNums;
      if (iObj < pVVar3->nSize) {
        iVar6 = 0;
        while( true ) {
          if (pVVar3->pArray[(uint)iObj] <= iVar6) {
            Vec_IntPush(vNodes,iObj);
            return;
          }
          uVar1 = p->vFanout->nSize;
          if ((int)uVar1 <= iObj) break;
          piVar2 = p->vFanout->pArray;
          uVar5 = piVar2[(uint)iObj] + iVar6;
          if (((int)uVar5 < 0) || (uVar1 <= uVar5)) break;
          Gia_ManCollectTfo_rec(p,piVar2[uVar5],vNodes);
          iVar6 = iVar6 + 1;
          pVVar3 = p->vFanoutNums;
          if (pVVar3->nSize <= iObj) break;
        }
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
  }
  return;
}

Assistant:

void Gia_ManCollectTfo_rec( Gia_Man_t * p, int iObj, Vec_Int_t * vNodes )
{
    Gia_Obj_t * pObj; int i, iFan;
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsCo(pObj) )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ObjForEachFanoutStaticId( p, iObj, iFan, i )
        Gia_ManCollectTfo_rec( p, iFan, vNodes );
    Vec_IntPush( vNodes, iObj );
}